

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::try_to_store_message_to_queue
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  anon_class_24_3_b3d561ce logging_lambda;
  anon_class_16_2_f638b178 __p;
  bool bVar1;
  demand_t *d;
  type_index *in_stack_fffffffffffffef0;
  allocator *paVar2;
  allocator local_b9;
  string local_b8 [36];
  overflow_reaction_t local_94;
  mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *pmStack_90;
  overflow_reaction_t reaction;
  bool *local_88;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80 [3];
  bool local_65 [5];
  undefined1 local_60 [3];
  bool queue_full;
  unique_lock<std::mutex> lock;
  deliver_op_tracer tracer;
  invocation_type_t demand_type_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *this_local;
  
  so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::deliver_op_tracer
            ((deliver_op_tracer *)&lock._M_owns,&this->super_mchain_tracing_enabled_base,
             &this->super_abstract_message_chain_t,msg_type,message,demand_type);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_60,&this->m_lock);
  if (this->m_status == closed) {
    local_65[1] = true;
    local_65[2] = false;
    local_65[3] = false;
    local_65[4] = false;
  }
  else {
    local_65[0] = details::unlimited_demand_queue::is_full(&this->m_queue);
    if ((local_65[0]) && (bVar1 = capacity_t::is_overflow_timeout_defined(&this->m_capacity), bVar1)
       ) {
      local_80[0].__r = (rep)capacity_t::overflow_timeout(&this->m_capacity);
      local_88 = local_65;
      __p.queue_full = local_88;
      __p.this = this;
      pmStack_90 = this;
      std::condition_variable::
      wait_for<long,std::ratio<1l,1000000000l>,so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                (&this->m_overflow_cond,(unique_lock<std::mutex> *)local_60,local_80,__p);
    }
    if ((local_65[0] & 1U) != 0) {
      local_94 = capacity_t::overflow_reaction(&this->m_capacity);
      if (local_94 == drop_newest) {
        so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
        overflow_drop_newest((deliver_op_tracer *)&lock._M_owns);
        local_65[1] = true;
        local_65[2] = false;
        local_65[3] = false;
        local_65[4] = false;
        goto LAB_00485027;
      }
      if (local_94 == remove_oldest) {
        d = details::unlimited_demand_queue::front(&this->m_queue);
        so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
        overflow_remove_oldest((deliver_op_tracer *)&lock._M_owns,d);
        details::unlimited_demand_queue::pop_front(&this->m_queue);
      }
      else if (local_94 == throw_exception) {
        so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
        overflow_throw_exception((deliver_op_tracer *)&lock._M_owns);
        paVar2 = &local_b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b8,
                   "an attempt to push message to full mchain with overflow_reaction_t::throw_exception policy"
                   ,paVar2);
        exception_t::raise(0x51c12d);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      else {
        logging_lambda.this =
             (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
              *)msg_type;
        logging_lambda.tracer = (deliver_op_tracer *)this;
        logging_lambda.msg_type = in_stack_fffffffffffffef0;
        so_5::details::
        abort_on_fatal_error<so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_2_>
                  (logging_lambda);
      }
    }
    complete_store_message_to_queue
              (this,(deliver_op_tracer *)&lock._M_owns,msg_type,message,demand_type);
    local_65[1] = false;
    local_65[2] = false;
    local_65[3] = false;
    local_65[4] = false;
  }
LAB_00485027:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  return;
}

Assistant:

void
		try_to_store_message_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				// If queue full and waiting on full queue is enabled we
				// must wait for some time until there will be some space in
				// the queue.
				bool queue_full = m_queue.is_full();
				if( queue_full && m_capacity.is_overflow_timeout_defined() )
					{
						m_overflow_cond.wait_for(
								lock,
								m_capacity.overflow_timeout(),
								[this, &queue_full] {
									queue_full = m_queue.is_full();
									return !queue_full ||
											details::status::closed == m_status;
								} );
					}

				// If queue still full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else if( overflow_reaction_t::throw_exception == reaction )
							{
								tracer.overflow_throw_exception();
								SO_5_THROW_EXCEPTION(
										rc_msg_chain_overflow,
										"an attempt to push message to full mchain "
										"with overflow_reaction_t::throw_exception policy" );
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}